

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall asl::Array<char>::alloc(Array<char> *this,int m)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  
  iVar3 = 3;
  if (3 < m) {
    iVar3 = m;
  }
  piVar1 = (int *)malloc((ulong)(iVar3 + 0x10));
  if (piVar1 != (int *)0x0) {
    this->_a = (char *)(piVar1 + 4);
    piVar1[1] = iVar3;
    *piVar1 = m;
    piVar1[2] = 1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void Array<T>::alloc(int m)
{
	int s=max(m, 3);
	char* p = (char*) malloc( s*sizeof(T)+sizeof(Data) );
	if(!p)
		ASL_BAD_ALLOC();
	_a = (T*) ( p + sizeof(Data) );
	ASL_RC_INIT();
	d().s = s;
	d().n = m;
	d().rc=1;
	asl_construct(_a, m);
}